

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

void bam_plp_destroy(bam_plp_t iter)

{
  bam_plp_t iter_local;
  
  if (iter->overlaps != (olap_hash_t *)0x0) {
    kh_destroy_olap_hash(iter->overlaps);
  }
  mp_free(iter->mp,iter->dummy);
  mp_free(iter->mp,iter->head);
  if (iter->mp->cnt != 0) {
    fprintf(_stderr,"[bam_plp_destroy] memory leak: %d. Continue anyway.\n",
            (ulong)(uint)iter->mp->cnt);
  }
  mp_destroy(iter->mp);
  if (iter->b != (bam1_t *)0x0) {
    bam_destroy1(iter->b);
  }
  free(iter->plp);
  free(iter);
  return;
}

Assistant:

void bam_plp_destroy(bam_plp_t iter)
{
    if ( iter->overlaps ) kh_destroy(olap_hash, iter->overlaps);
    mp_free(iter->mp, iter->dummy);
    mp_free(iter->mp, iter->head);
    if (iter->mp->cnt != 0)
        fprintf(stderr, "[bam_plp_destroy] memory leak: %d. Continue anyway.\n", iter->mp->cnt);
    mp_destroy(iter->mp);
    if (iter->b) bam_destroy1(iter->b);
    free(iter->plp);
    free(iter);
}